

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

WeightParams * __thiscall
CoreML::Specification::GRULayerParams::_internal_mutable_updategatebiasvector(GRULayerParams *this)

{
  ulong uVar1;
  WeightParams *pWVar2;
  Arena *arena;
  
  if (this->updategatebiasvector_ != (WeightParams *)0x0) {
    return this->updategatebiasvector_;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    arena = *(Arena **)arena;
  }
  pWVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>(arena);
  this->updategatebiasvector_ = pWVar2;
  return pWVar2;
}

Assistant:

inline ::CoreML::Specification::WeightParams* GRULayerParams::_internal_mutable_updategatebiasvector() {
  
  if (updategatebiasvector_ == nullptr) {
    auto* p = CreateMaybeMessage<::CoreML::Specification::WeightParams>(GetArenaForAllocation());
    updategatebiasvector_ = p;
  }
  return updategatebiasvector_;
}